

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O1

bool vera::loadOBJ(string *_filename,Scene *_scene,bool _verbose)

{
  size_type *psVar1;
  ulong *puVar2;
  MaterialsMap *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  pointer pcVar8;
  pointer puVar9;
  pointer piVar10;
  _Base_ptr p_Var11;
  MaterialsMap *pMVar12;
  bool bVar13;
  ostream *poVar14;
  size_t sVar15;
  iterator iVar16;
  Material *pMVar17;
  mapped_type *ppMVar18;
  pointer paVar19;
  mapped_type *pmVar20;
  _Base_ptr p_Var21;
  mapped_type *_normal;
  undefined8 *puVar22;
  pointer paVar23;
  _Rb_tree_header *p_Var24;
  undefined7 in_register_00000011;
  bool _verbose_00;
  undefined4 uVar25;
  _Rb_tree_header *p_Var26;
  ulong uVar27;
  undefined8 uVar28;
  ulong uVar29;
  ulong uVar30;
  uint32_t _i;
  long lVar31;
  bool bVar32;
  int mCounter;
  string meshName;
  unsigned_long local_318;
  undefined4 local_30c;
  string local_308;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  Scene *local_2c8;
  map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
  unique_indices;
  int local_28c;
  int vi;
  undefined4 uStack_284;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string name;
  Material *local_208;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  string err;
  string warn;
  attrib_t attrib;
  string base_dir;
  Mesh mesh;
  
  local_2c8 = _scene;
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&mesh,(_filename->_M_dataplus)._M_p,(allocator *)&smoothVertexNormals);
  getBaseDir(&base_dir,(string *)&mesh);
  if ((pointer *)mesh._vptr_Mesh !=
      &mesh.m_colors.
       super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(mesh._vptr_Mesh);
  }
  bVar13 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,(_filename->_M_dataplus)._M_p,
                            base_dir._M_dataplus._M_p,true,true);
  if (warn._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if (err._M_string_length != 0) {
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if (bVar13) {
    if (_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Loading ",8);
      pcVar7 = (_filename->_M_dataplus)._M_p;
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x467ea0);
      }
      else {
        sVar15 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar15);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      printf("    Total vertices  = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.vertices.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total colors    = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.colors.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.colors.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total normals   = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.normals.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.normals.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total texcoords = %d\n",
             (ulong)(uint)((int)(((uint)((ulong)((long)attrib.texcoords.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)attrib.texcoords.
                                                                                                            
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 0x21)
                                 & 1) + (int)((ulong)((long)attrib.texcoords.
                                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)attrib.texcoords.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2))
                          >> 1));
      printf("    Total materials = %d\n",
             (ulong)(uint)((int)((ulong)((long)materials.
                                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          0x1fdcd759));
      printf("    Total shapes    = %d\n",
             (ulong)(uint)((int)((ulong)((long)shapes.
                                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)shapes.
                                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                          -0x49249249));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Shapes: ",8);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
    local_30c = (undefined4)CONCAT71(in_register_00000011,_verbose);
    if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pMVar3 = &local_2c8->materials;
      pMVar12 = &local_2c8->materials;
      lVar31 = 0;
      uVar30 = 0;
      do {
        iVar16 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::find(&pMVar3->_M_t,
                        (key_type *)
                        ((long)(materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar31 + -0x20
                        ));
        if ((_Rb_tree_header *)iVar16._M_node == &(pMVar12->_M_t)._M_impl.super__Rb_tree_header) {
          if ((char)local_30c != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Add Material ",0xd);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 *(char **)((long)(materials.
                                                                                                      
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ambient + lVar31 + -0x20),
                                 *(long *)((long)(materials.
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 ambient + lVar31 + -0x18));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          pMVar17 = InitMaterial((material_t *)
                                 ((long)(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->ambient +
                                 lVar31 + -0x20),local_2c8,&base_dir);
          ppMVar18 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                     ::operator[](pMVar3,(key_type *)
                                         ((long)(materials.
                                                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->ambient
                                         + lVar31 + -0x20));
          *ppMVar18 = pMVar17;
        }
        uVar30 = uVar30 + 1;
        lVar31 = lVar31 + 0x748;
      } while (uVar30 < (ulong)(((long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759));
    }
    local_318 = 0;
    if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pMVar3 = &local_2c8->materials;
      pMVar12 = &local_2c8->materials;
      uVar25 = local_30c;
      do {
        p_Var26 = &unique_indices._M_t._M_impl.super__Rb_tree_header;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        pcVar8 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_318].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&name,pcVar8,
                   pcVar8 + shapes.
                            super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_318].name.
                            _M_string_length);
        if (name._M_string_length == 0) {
          toString<unsigned_long>((string *)&mesh,&local_318);
          std::__cxx11::string::operator=((string *)&name,(string *)&mesh);
          if ((pointer *)mesh._vptr_Mesh !=
              &mesh.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(mesh._vptr_Mesh);
          }
        }
        _verbose_00 = SUB41(uVar25,0);
        if (_verbose_00 != false) {
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,name._M_dataplus._M_p,name._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
        }
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        puVar9 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_318].mesh.smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar31 = (long)shapes.
                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_318].mesh.smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar9;
        bVar32 = lVar31 != 0;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (lVar31 == 0) {
LAB_002b7ca5:
          if (bVar32) goto LAB_002b7ca9;
        }
        else {
          uVar30 = lVar31 >> 2;
          if (*puVar9 == 0) {
            uVar27 = 1;
            do {
              uVar29 = uVar27;
              if (uVar30 + (uVar30 == 0) == uVar29) break;
              uVar27 = uVar29 + 1;
            } while (puVar9[uVar29] == 0);
            bVar32 = uVar29 < uVar30;
            goto LAB_002b7ca5;
          }
LAB_002b7ca9:
          if (_verbose_00 != false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    . Compute smoothingNormal",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
          computeSmoothingNormals
                    (&attrib,shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_318,
                     &smoothVertexNormals);
        }
        Mesh::Mesh(&mesh);
        mesh.m_drawMode = TRIANGLES;
        unique_indices._M_t._M_impl._0_8_ =
             &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
        iVar16 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::find(&pMVar3->_M_t,(key_type *)&unique_indices);
        if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ !=
            &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
        }
        if ((_Rb_tree_header *)iVar16._M_node == &(pMVar12->_M_t)._M_impl.super__Rb_tree_header) {
          pMVar17 = (Material *)operator_new(0x150);
          unique_indices._M_t._M_impl._0_8_ =
               &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
          Material::Material(pMVar17,(key_type *)&unique_indices);
          meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&meshName,"default","");
          ppMVar18 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                     ::operator[](pMVar3,&meshName);
          *ppMVar18 = pMVar17;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)meshName._M_dataplus._M_p != &meshName.field_2) {
            operator_delete(meshName._M_dataplus._M_p);
          }
          if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ !=
              &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
          }
        }
        unique_indices._M_t._M_impl._0_8_ =
             &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
        ppMVar18 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](pMVar3,(key_type *)&unique_indices);
        local_208 = *ppMVar18;
        if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ !=
            &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
        }
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mCounter = 0;
        paVar23 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_318].mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var26->_M_header;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var26->_M_header;
        if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
            super__Vector_impl_data._M_start[local_318].mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar23) {
          paVar19 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_318;
          _i = 0;
          local_28c = -1;
          uVar30 = 0;
          do {
            iVar4 = paVar23[uVar30].normal_index;
            iVar5 = paVar23[uVar30].texcoord_index;
            vi = paVar23[uVar30].vertex_index;
            piVar10 = (paVar19->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (((paVar19->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish != piVar10) &&
               (iVar6 = piVar10[(int)(uVar30 / 3)], local_28c != iVar6)) {
              if ((local_28c != -1) &&
                 (mesh.m_vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  mesh.m_vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                local_2e8 = &local_2d8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e8,name._M_dataplus._M_p,
                           name._M_dataplus._M_p + name._M_string_length);
                std::__cxx11::string::append((char *)&local_2e8);
                toString<int>(&local_308,&mCounter,3,'0');
                uVar27 = 0xf;
                if (local_2e8 != &local_2d8) {
                  uVar27 = local_2d8;
                }
                if (uVar27 < local_308._M_string_length + local_2e0) {
                  uVar28 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p != &local_308.field_2) {
                    uVar28 = local_308.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar28 < local_308._M_string_length + local_2e0) goto LAB_002b8014;
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_308,0,(char *)0x0,(ulong)local_2e8);
                }
                else {
LAB_002b8014:
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_2e8,(ulong)local_308._M_dataplus._M_p);
                }
                psVar1 = puVar22 + 2;
                if ((size_type *)*puVar22 == psVar1) {
                  meshName.field_2._M_allocated_capacity = *psVar1;
                  meshName.field_2._8_8_ = puVar22[3];
                  meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
                }
                else {
                  meshName.field_2._M_allocated_capacity = *psVar1;
                  meshName._M_dataplus._M_p = (pointer)*puVar22;
                }
                meshName._M_string_length = puVar22[1];
                *puVar22 = psVar1;
                puVar22[1] = 0;
                *(char *)psVar1 = '\0';
                addModel(local_2c8,&meshName,&mesh,local_208,_verbose_00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)meshName._M_dataplus._M_p != &meshName.field_2) {
                  operator_delete(meshName._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p);
                }
                if (local_2e8 != &local_2d8) {
                  operator_delete(local_2e8);
                }
                mCounter = mCounter + 1;
                Mesh::clear(&mesh);
                std::
                _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                ::clear(&unique_indices._M_t);
                _i = 0;
              }
              ppMVar18 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                         ::operator[](pMVar3,&materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[iVar6].name)
              ;
              local_208 = *ppMVar18;
              local_28c = iVar6;
            }
            p_Var21 = &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header;
            for (p_Var11 = unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < vi]) {
              if (vi <= (int)*(size_t *)(p_Var11 + 1)) {
                p_Var21 = p_Var11;
              }
            }
            p_Var26 = &unique_indices._M_t._M_impl.super__Rb_tree_header;
            p_Var24 = p_Var26;
            if (((_Rb_tree_header *)p_Var21 != p_Var26) &&
               (p_Var24 = (_Rb_tree_header *)p_Var21,
               vi < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
              p_Var24 = p_Var26;
            }
            if (((p_Var24 == p_Var26) || (*(int *)(p_Var24 + 1) != iVar4)) ||
               (*(int *)((long)(p_Var24 + 1) + 4) != iVar5)) {
              pmVar20 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar20->vertex_index = _i;
              pmVar20 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar20->normal_index = iVar4;
              pmVar20 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar20->texcoord_index = iVar5;
              meshName._M_dataplus._M_p =
                   *(pointer *)
                    (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)vi * 3);
              meshName._M_string_length =
                   CONCAT44(meshName._M_string_length._4_4_,
                            attrib.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[(long)vi * 3 + 2]);
              Mesh::addVertex(&mesh,(vec3 *)&meshName);
              meshName._M_dataplus._M_p =
                   *(pointer *)
                    (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)vi * 3);
              meshName._M_string_length =
                   CONCAT44(0x3f800000,
                            attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)vi * 3 + 2]);
              Mesh::addColor(&mesh,(vec4 *)&meshName);
              if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                if (smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  p_Var21 = &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
                  for (p_Var11 = smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                      p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < vi]) {
                    if (vi <= (int)*(size_t *)(p_Var11 + 1)) {
                      p_Var21 = p_Var11;
                    }
                  }
                  p_Var26 = &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header;
                  p_Var24 = p_Var26;
                  if (((_Rb_tree_header *)p_Var21 != p_Var26) &&
                     (p_Var24 = (_Rb_tree_header *)p_Var21,
                     vi < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
                    p_Var24 = p_Var26;
                  }
                  if (p_Var24 != p_Var26) {
                    _normal = std::
                              map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                              ::at(&smoothVertexNormals,&vi);
                    Mesh::addNormal(&mesh,_normal);
                  }
                }
              }
              else {
                meshName._M_dataplus._M_p =
                     *(pointer *)
                      (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)iVar4 * 3);
                meshName._M_string_length =
                     CONCAT44(meshName._M_string_length._4_4_,
                              attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start[(long)iVar4 * 3 + 2]);
                Mesh::addNormal(&mesh,(vec3 *)&meshName);
              }
              if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                meshName._M_dataplus._M_p =
                     (pointer)CONCAT44(1.0 - attrib.texcoords.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar5 * 2 + 1]
                                       ,attrib.texcoords.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start[(long)iVar5 * 2]);
                Mesh::addTexCoord(&mesh,(vec2 *)&meshName);
              }
              Mesh::addIndex(&mesh,_i);
              _i = _i + 1;
            }
            else {
              Mesh::addIndex(&mesh,*(uint32_t *)((long)&p_Var24->_M_node_count + 4));
            }
            uVar30 = uVar30 + 1;
            paVar19 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_318;
            paVar23 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_318].mesh.indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar30 < (ulong)(((long)shapes.
                                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_318].mesh
                                           .indices.
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)paVar23 >> 2) * -0x5555555555555555));
        }
        meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&meshName,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        uVar25 = local_30c;
        if (0 < mCounter) {
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_308,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_308);
          toString<int>((string *)&vi,&mCounter,3,'0');
          uVar28 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            uVar28 = local_308.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 < local_280 + local_308._M_string_length) {
            uVar28 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_284,vi) != &local_278) {
              uVar28 = local_278._M_allocated_capacity;
            }
            if ((ulong)uVar28 < local_280 + local_308._M_string_length) goto LAB_002b84e2;
            puVar22 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&vi,0,(char *)0x0,(ulong)local_308._M_dataplus._M_p);
          }
          else {
LAB_002b84e2:
            puVar22 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_308,CONCAT44(uStack_284,vi));
          }
          puVar2 = puVar22 + 2;
          if ((ulong *)*puVar22 == puVar2) {
            local_2d8 = *puVar2;
            uStack_2d0 = puVar22[3];
            local_2e8 = &local_2d8;
          }
          else {
            local_2d8 = *puVar2;
            local_2e8 = (ulong *)*puVar22;
          }
          local_2e0 = puVar22[1];
          *puVar22 = puVar2;
          puVar22[1] = 0;
          *(undefined1 *)puVar2 = 0;
          std::__cxx11::string::operator=((string *)&meshName,(string *)&local_2e8);
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_284,vi) != &local_278) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_284,vi));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
        }
        addModel(local_2c8,&meshName,&mesh,local_208,_verbose_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)meshName._M_dataplus._M_p != &meshName.field_2) {
          operator_delete(meshName._M_dataplus._M_p);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
        ::~_Rb_tree(&unique_indices._M_t);
        Mesh::~Mesh(&mesh);
        std::
        _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
        ::~_Rb_tree(&smoothVertexNormals._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
        }
        local_318 = local_318 + 1;
      } while (local_318 <
               (ulong)(((long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7))
      ;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to load ",0xf);
    pcVar7 = (_filename->_M_dataplus)._M_p;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x467ea0);
    }
    else {
      sVar15 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar15);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_dir._M_dataplus._M_p != &base_dir.field_2) {
    operator_delete(base_dir._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar13;
}

Assistant:

bool loadOBJ(const std::string& _filename, Scene* _scene, bool _verbose) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) {
        std::cout << "WARN: " << warn << std::endl;
    }
    if (!err.empty()) {
        std::cerr << err << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    // Append `default` material
    // materials.push_back(tinyobj::material_t());

    if (_verbose) {
        std::cerr << "Loading " << _filename.c_str() << std::endl;
        printf("    Total vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
        printf("    Total colors    = %d\n", (int)(attrib.colors.size()) / 3);
        printf("    Total normals   = %d\n", (int)(attrib.normals.size()) / 3);
        printf("    Total texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
        printf("    Total materials = %d\n", (int)materials.size());
        printf("    Total shapes    = %d\n", (int)shapes.size());

        std::cerr << "Shapes: " << std::endl;
    }

    for (size_t m = 0; m < materials.size(); m++) {
        if ( _scene->materials.find( materials[m].name ) == _scene->materials.end() ) {
            if (_verbose)
                std::cout << "Add Material " << materials[m].name << std::endl;

            _scene->materials[ materials[m].name ] = InitMaterial( materials[m], _scene, base_dir );
        }
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        if (_verbose)
            std::cerr << name << std::endl;

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0) {
            if (_verbose)
                std::cout << "    . Compute smoothingNormal" << std::endl;
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);
        }

        Mesh mesh;
        mesh.setDrawMode(TRIANGLES);

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* mat = _scene->materials["default"];

        std::map<int, tinyobj::index_t> unique_indices;
        std::map<int, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        int mCounter = 0;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {
            int f = (int)floor(i/3);

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // Associate w material
            if (shapes[s].mesh.material_ids.size() > 0) {
                int material_index = shapes[s].mesh.material_ids[f];
                if (mi != material_index) {

                    // If there is a switch of material start a new mesh
                    if (mi != -1 && mesh.getVertices().size() > 0) {

                        // std::cout << "Adding model " << name  << "_" << toString(mCounter, 3, '0') << " w new material " << mat.name << std::endl;
                        
                        // Add the model to the stack 
                        addModel(_scene, name + "_"+ toString(mCounter,3,'0'), mesh, mat, _verbose);
                        mCounter++;

                        // Restart the mesh
                        iCounter = 0;
                        mesh.clear();
                        unique_indices.clear();
                    }

                    // assign the current material
                    mi = material_index;
                    mat = _scene->materials[ materials[material_index].name ];
                }
            }

            bool reuse = false;
            iter = unique_indices.find(vi);

                        // if already exist 
            if (iter != unique_indices.end())
                // and have the same attributes
                if ((iter->second.normal_index == ni) &&
                    (iter->second.texcoord_index == ti) )
                    reuse = true;
            
            // Re use the vertex
            if (reuse)
                mesh.addIndex( (INDEX_TYPE)iter->second.vertex_index );
            // Other wise create a new one
            else {
                unique_indices[vi].vertex_index = (int)iCounter;
                unique_indices[vi].normal_index = ni;
                unique_indices[vi].texcoord_index = ti;
                
                mesh.addVertex( getVertex(attrib, vi) );
                mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    mesh.addTexCoord( getTexCoords(attrib, ti) );

                mesh.addIndex( iCounter++ );
            }
        }

        std::string meshName = name;
        if (mCounter > 0)
            meshName = name + "_" + toString(mCounter, 3, '0');

        // std::cout << "Adding model " << meshName << " w material " << mat.name << std::endl;
        addModel(_scene, meshName, mesh, mat, _verbose);
    }

    return true;
}